

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::Application(Application *this,AppConfig config)

{
  PathTracer *this_00;
  Application *this_local;
  
  Renderer::Renderer(&this->super_Renderer);
  (this->super_Renderer)._vptr_Renderer = (_func_int **)&PTR__Application_003951f8;
  std::
  map<CMU462::DynamicScene::Joint_*,_CMU462::Vector3D,_std::less<CMU462::DynamicScene::Joint_*>,_std::allocator<std::pair<CMU462::DynamicScene::Joint_*const,_CMU462::Vector3D>_>_>
  ::map(&this->ikTargets);
  Camera::Camera(&this->camera);
  Camera::Camera(&this->canonicalCamera);
  DynamicScene::DrawStyle::DrawStyle(&this->defaultStyle);
  DynamicScene::DrawStyle::DrawStyle(&this->hoverStyle);
  DynamicScene::DrawStyle::DrawStyle(&this->selectStyle);
  OSDText::OSDText(&this->textManager);
  Color::Color(&this->text_color,0.0,0.0,0.0,1.0);
  std::vector<int,_std::allocator<int>_>::vector(&this->messages);
  Timeline::Timeline(&this->timeline);
  this->scene = (Scene *)0x0;
  this_00 = (PathTracer *)operator_new(0x1e8);
  PathTracer::PathTracer
            (this_00,config.pathtracer_ns_aa,config.pathtracer_max_ray_depth,
             config.pathtracer_ns_area_light,config.pathtracer_ns_diff,config.pathtracer_ns_glsy,
             config.pathtracer_ns_refr,config.pathtracer_num_threads,config.pathtracer_envmap);
  this->pathtracer = this_00;
  this->timestep = 0.1;
  this->damping_factor = 0.0;
  this->readyWrite = false;
  this->readyLoad = false;
  this->useCapsuleRadius = true;
  return;
}

Assistant:

Application::Application(AppConfig config)
{
   scene = nullptr;

   pathtracer = new PathTracer (
         config.pathtracer_ns_aa,
         config.pathtracer_max_ray_depth,
         config.pathtracer_ns_area_light,
         config.pathtracer_ns_diff,
         config.pathtracer_ns_glsy,
         config.pathtracer_ns_refr,
         config.pathtracer_num_threads,
         config.pathtracer_envmap
         );

   timestep = 0.1;
   damping_factor = 0.0;

   readyWrite = false;
   readyLoad = false;
   useCapsuleRadius = true;
}